

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zStream.c
# Opt level: O1

SRes SeqInStream_Read2(ISeqInStream *stream,void *buf,size_t size,SRes errorType)

{
  bool bVar1;
  SRes SVar2;
  SRes unaff_EBP;
  size_t processed;
  size_t local_38;
  
  do {
    if (size == 0) {
      return 0;
    }
    local_38 = size;
    SVar2 = (*stream->Read)(stream,buf,&local_38);
    if (SVar2 == 0) {
      if (local_38 == 0) {
        bVar1 = false;
        unaff_EBP = errorType;
      }
      else {
        buf = (void *)((long)buf + local_38);
        size = size - local_38;
        bVar1 = true;
      }
    }
    else {
      bVar1 = false;
      unaff_EBP = SVar2;
    }
  } while (bVar1);
  return unaff_EBP;
}

Assistant:

SRes SeqInStream_Read2(ISeqInStream *stream, void *buf, size_t size, SRes errorType)
{
  while (size != 0)
  {
    size_t processed = size;
    RINOK(stream->Read(stream, buf, &processed));
    if (processed == 0)
      return errorType;
    buf = (void *)((Byte *)buf + processed);
    size -= processed;
  }
  return SZ_OK;
}